

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

tensor_traits * ggml_aarch64_get_optimal_repack_type(ggml_tensor *cur)

{
  int iVar1;
  int *in_RDI;
  pointer_____offset_0x10___ *local_8;
  
  if (*in_RDI == 2) {
    iVar1 = ggml_cpu_has_avx2();
    if (((iVar1 != 0) ||
        (((iVar1 = ggml_cpu_has_sve(), iVar1 != 0 &&
          (iVar1 = ggml_cpu_has_matmul_int8(), iVar1 != 0)) &&
         (iVar1 = ggml_cpu_get_sve_cnt(), iVar1 == 0x20)))) && (*(long *)(in_RDI + 6) % 8 == 0)) {
      local_8 = &ggml::cpu::aarch64::q4_0_8x8_q8_0;
      return (tensor_traits *)local_8;
    }
    iVar1 = ggml_cpu_has_neon();
    if (((iVar1 != 0) && (iVar1 = ggml_cpu_has_matmul_int8(), iVar1 != 0)) &&
       (*(long *)(in_RDI + 6) % 4 == 0)) {
      local_8 = &ggml::cpu::aarch64::q4_0_4x8_q8_0;
      return (tensor_traits *)local_8;
    }
    iVar1 = ggml_cpu_has_neon();
    if (((iVar1 != 0) && (iVar1 = ggml_cpu_has_dotprod(), iVar1 != 0)) &&
       (*(long *)(in_RDI + 6) % 4 == 0)) {
      local_8 = &ggml::cpu::aarch64::q4_0_4x4_q8_0;
      return (tensor_traits *)local_8;
    }
  }
  else if (*in_RDI == 0xc) {
    iVar1 = ggml_cpu_has_avx2();
    if ((iVar1 != 0) && (*(long *)(in_RDI + 6) % 8 == 0)) {
      local_8 = &ggml::cpu::aarch64::q4_K_8x8_q8_K;
      return (tensor_traits *)local_8;
    }
  }
  else if ((((*in_RDI == 0x14) && (iVar1 = ggml_cpu_has_neon(), iVar1 != 0)) &&
           (iVar1 = ggml_cpu_has_dotprod(), iVar1 != 0)) && (*(long *)(in_RDI + 6) % 4 == 0)) {
    local_8 = &ggml::cpu::aarch64::iq4_nl_4x4_q8_0;
    return (tensor_traits *)local_8;
  }
  return (tensor_traits *)0x0;
}

Assistant:

static const ggml::cpu::tensor_traits * ggml_aarch64_get_optimal_repack_type(const struct ggml_tensor * cur) {
    if (cur->type == GGML_TYPE_Q4_0) {
        if (ggml_cpu_has_avx2() || (ggml_cpu_has_sve() && ggml_cpu_has_matmul_int8() && ggml_cpu_get_sve_cnt() == QK8_0)) {
            if (cur->ne[1] % 8 == 0) {
                return &ggml::cpu::aarch64::q4_0_8x8_q8_0;
            }
        }
        if (ggml_cpu_has_neon() && ggml_cpu_has_matmul_int8()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::q4_0_4x8_q8_0;
            }
        }
        if (ggml_cpu_has_neon() && ggml_cpu_has_dotprod()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::q4_0_4x4_q8_0;
            }
        }
    } else if (cur->type == GGML_TYPE_Q4_K) {
        if (ggml_cpu_has_avx2()) {
            if (cur->ne[1] % 8 == 0) {
                return &ggml::cpu::aarch64::q4_K_8x8_q8_K;
            }
        }
    } else if (cur->type == GGML_TYPE_IQ4_NL) {
        if (ggml_cpu_has_neon() && ggml_cpu_has_dotprod()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::iq4_nl_4x4_q8_0;
            }
        }
    }

    return nullptr;
}